

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O2

bool __thiscall
QTextLineItemIterator::getSelectionBounds
          (QTextLineItemIterator *this,QFixed *selectionX,QFixed *selectionWidth)

{
  ushort uVar1;
  FormatRange *pFVar2;
  QScriptItem *pQVar3;
  unsigned_short *puVar4;
  bool bVar5;
  QFixed QVar6;
  int iVar7;
  uint glyph_pos;
  int iVar8;
  int iVar9;
  unsigned_short *puVar10;
  int g;
  uint uVar11;
  uint glyph_pos_00;
  int iVar12;
  long in_FS_OFFSET;
  QGlyphLayout glyphs;
  undefined1 local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  selectionWidth->val = 0;
  selectionX->val = 0;
  pFVar2 = this->selection;
  if (pFVar2 == (FormatRange *)0x0) {
LAB_004892cd:
    bVar5 = false;
  }
  else {
    pQVar3 = this->si;
    if (((uint)pQVar3->analysis & 0xf00) < 0x601) {
      puVar4 = this->eng->layoutData->logClustersPtr;
      iVar12 = pQVar3->position;
      local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextEngine::shapedGlyphs((QGlyphLayout *)local_68,this->eng,pQVar3);
      iVar9 = this->selection->start;
      iVar7 = this->itemStart;
      if (this->itemStart <= iVar9) {
        iVar7 = iVar9;
      }
      iVar9 = iVar9 + this->selection->length;
      if (this->itemEnd < iVar9) {
        iVar9 = this->itemEnd;
      }
      if (iVar9 <= iVar7) goto LAB_004892cd;
      pQVar3 = this->si;
      iVar7 = iVar7 - pQVar3->position;
      iVar9 = iVar9 - pQVar3->position;
      puVar10 = puVar4 + (long)iVar12 + (long)iVar9;
      if (iVar9 == this->itemLength) {
        puVar10 = &pQVar3->num_glyphs;
      }
      uVar1 = puVar4[(long)iVar12 + (long)iVar7];
      glyph_pos = (uint)uVar1;
      glyph_pos_00 = (uint)*puVar10;
      if (((pQVar3->analysis).field_0x2 & 1) == 0) {
        iVar8 = 0;
        for (iVar12 = this->glyphsStart; iVar12 < (int)(uint)uVar1; iVar12 = iVar12 + 1) {
          QVar6 = QGlyphLayout::effectiveAdvance((QGlyphLayout *)local_68,iVar12);
          iVar8 = iVar8 + QVar6.val;
        }
        iVar12 = 0;
        for (uVar11 = glyph_pos; uVar11 < glyph_pos_00; uVar11 = uVar11 + 1) {
          QVar6 = QGlyphLayout::effectiveAdvance((QGlyphLayout *)local_68,uVar11);
          iVar12 = iVar12 + QVar6.val;
        }
      }
      else {
        iVar12 = this->glyphsEnd;
        iVar8 = 0;
        while ((int)glyph_pos_00 < iVar12) {
          iVar12 = iVar12 + -1;
          QVar6 = QGlyphLayout::effectiveAdvance((QGlyphLayout *)local_68,iVar12);
          iVar8 = iVar8 + QVar6.val;
        }
        iVar12 = 0;
        uVar11 = glyph_pos_00;
        while ((int)glyph_pos < (int)uVar11) {
          uVar11 = uVar11 - 1;
          QVar6 = QGlyphLayout::effectiveAdvance((QGlyphLayout *)local_68,uVar11);
          iVar12 = iVar12 + QVar6.val;
        }
      }
      QVar6 = QTextEngine::offsetInLigature(this->eng,this->si,iVar7,iVar9,glyph_pos);
      selectionX->val = iVar8 + QVar6.val + (this->x).val;
      selectionWidth->val = iVar12 - QVar6.val;
      QVar6 = QTextEngine::offsetInLigature(this->eng,this->si,iVar9,this->itemLength,glyph_pos_00);
      selectionWidth->val = selectionWidth->val + QVar6.val;
    }
    else {
      if ((pFVar2->length + pFVar2->start <= pQVar3->position) ||
         (pQVar3->position + this->itemLength <= pFVar2->start)) goto LAB_004892cd;
      selectionX->val = (this->x).val;
      selectionWidth->val = (this->itemWidth).val;
    }
    bVar5 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QTextLineItemIterator::getSelectionBounds(QFixed *selectionX, QFixed *selectionWidth) const
{
    *selectionX = *selectionWidth = 0;

    if (!selection)
        return false;

    if (si->analysis.flags >= QScriptAnalysis::TabOrObject) {
        if (si->position >= selection->start + selection->length
            || si->position + itemLength <= selection->start)
            return false;

        *selectionX = x;
        *selectionWidth = itemWidth;
    } else {
        unsigned short *logClusters = eng->logClusters(si);
        QGlyphLayout glyphs = eng->shapedGlyphs(si);

        int from = qMax(itemStart, selection->start) - si->position;
        int to = qMin(itemEnd, selection->start + selection->length) - si->position;
        if (from >= to)
            return false;

        int start_glyph = logClusters[from];
        int end_glyph = (to == itemLength) ? si->num_glyphs : logClusters[to];
        QFixed soff;
        QFixed swidth;
        if (si->analysis.bidiLevel %2) {
            for (int g = glyphsEnd - 1; g >= end_glyph; --g)
                soff += glyphs.effectiveAdvance(g);
            for (int g = end_glyph - 1; g >= start_glyph; --g)
                swidth += glyphs.effectiveAdvance(g);
        } else {
            for (int g = glyphsStart; g < start_glyph; ++g)
                soff += glyphs.effectiveAdvance(g);
            for (int g = start_glyph; g < end_glyph; ++g)
                swidth += glyphs.effectiveAdvance(g);
        }

        // If the starting character is in the middle of a ligature,
        // selection should only contain the right part of that ligature
        // glyph, so we need to get the width of the left part here and
        // add it to *selectionX
        QFixed leftOffsetInLigature = eng->offsetInLigature(si, from, to, start_glyph);
        *selectionX = x + soff + leftOffsetInLigature;
        *selectionWidth = swidth - leftOffsetInLigature;
        // If the ending character is also part of a ligature, swidth does
        // not contain that part yet, we also need to find out the width of
        // that left part
        *selectionWidth += eng->offsetInLigature(si, to, itemLength, end_glyph);
    }
    return true;
}